

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::RunListFile
          (cmMakefile *this,cmListFile *listFile,string *filenametoread,DeferCommands *defer)

{
  cmStateSnapshot *pcVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  string *psVar5;
  _Base_ptr p_Var6;
  long lVar7;
  long lVar8;
  pointer pDVar9;
  ulong uVar10;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  cmExecutionStatus status;
  string id;
  DeferCallScope callScope;
  DeferScope scope;
  string currentFile;
  string currentParentFile;
  undefined1 local_158 [16];
  undefined1 local_148 [24];
  undefined4 local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [32];
  DeferCommands *local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  cmListFile *local_c0;
  DeferCallScope local_b8;
  DeferScope local_b0;
  string local_a8;
  _Base_ptr *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_68;
  bool local_48;
  string *local_40;
  cmStateSnapshot *local_38;
  
  local_f0 = defer;
  local_c0 = listFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_PARENT_LIST_FILE","");
  psVar5 = (string *)GetDefinition(this,(string *)local_158);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_88 = local_78;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_FILE","");
  psVar5 = (string *)GetDefinition(this,(string *)local_158);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_FILE","");
  value._M_str = (filenametoread->_M_dataplus)._M_p;
  value._M_len = filenametoread->_M_string_length;
  AddDefinition(this,(string *)local_158,value);
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_110,filenametoread);
  value_00._M_str = (char *)local_110._0_8_;
  value_00._M_len = local_110._8_8_;
  AddDefinition(this,(string *)local_158,value_00);
  if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_PARENT_LIST_FILE","");
  pcVar1 = &this->StateSnapshot;
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = (cmMakefile *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  local_40 = filenametoread;
  local_38 = pcVar1;
  if ((cmMakefile *)local_158._0_8_ != (cmMakefile *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  lVar8 = (long)(local_c0->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_c0->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 4;
    pcVar2 = local_148 + 8;
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    lVar7 = 0;
    do {
      local_148._16_6_ = 0x2e726f727265;
      local_148._8_6_ = 0x776f6e6b6e75;
      local_148._14_2_ = 0x206e;
      local_148._0_8_ = 0xe;
      local_148[0x16] = '\0';
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_130._0_1_ = false;
      local_130._1_1_ = false;
      local_130._2_1_ = false;
      local_130._3_1_ = false;
      local_48 = false;
      local_158._0_8_ = this;
      local_158._8_8_ = pcVar2;
      ExecuteCommand(this,(cmListFileFunction *)
                          ((long)(local_c0->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar7),
                     (cmExecutionStatus *)local_158,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68);
      if ((local_48 == true) &&
         (local_48 = false,
         local_68._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_68._M_value + 0x10))) {
        operator_delete((void *)local_68._M_value._M_dataplus._M_p,local_68._16_8_ + 1);
      }
      if ((cmSystemTools::s_FatalErrorOccurred != false) ||
         (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
LAB_0029a195:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        if ((pointer)local_158._8_8_ != pcVar2) {
          operator_delete((void *)local_158._8_8_,CONCAT26(local_148._14_2_,local_148._8_6_) + 1);
        }
        break;
      }
      if (local_130._0_1_ == true) {
        RaiseScope(this,&local_128);
        goto LAB_0029a195;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      if ((pointer)local_158._8_8_ != pcVar2) {
        operator_delete((void *)local_158._8_8_,CONCAT26(local_148._14_2_,local_148._8_6_) + 1);
      }
      lVar7 = lVar7 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  if (local_f0 != (DeferCommands *)0x0) {
    DeferScope::DeferScope(&local_b0,this,local_40);
    pDVar9 = (local_f0->Commands).
             super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((local_f0->Commands).
        super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>.
        _M_impl.super__Vector_impl_data._M_finish != pDVar9) {
      lVar8 = 0x20;
      uVar10 = 0;
      do {
        if (*(long *)((long)pDVar9 + lVar8 + -0x18) == 0) {
          cVar4 = '\a';
        }
        else {
          local_110._0_8_ = local_110 + 0x10;
          p_Var6 = (_Base_ptr)(lVar8 + -0x10 + (long)pDVar9);
          if (p_Var6 == p_Var6[-1]._M_left) {
            local_110._16_8_ = *(undefined8 *)p_Var6;
            local_110._24_8_ = p_Var6->_M_parent;
          }
          else {
            local_110._16_8_ = *(undefined8 *)p_Var6;
            local_110._0_8_ = p_Var6[-1]._M_left;
          }
          local_110._8_8_ = *(undefined8 *)((long)pDVar9 + lVar8 + -0x18);
          *(_Base_ptr *)((long)pDVar9 + lVar8 + -0x20) = p_Var6;
          *(undefined8 *)((long)pDVar9 + lVar8 + -0x18) = 0;
          *(undefined1 *)((long)pDVar9 + lVar8 + -0x10) = 0;
          DeferCallScope::DeferCallScope
                    (&local_b8,this,(string *)((long)&(pDVar9->Id)._M_dataplus._M_p + lVar8));
          local_148._16_6_ = 0x2e726f727265;
          local_148._8_6_ = 0x776f6e6b6e75;
          local_148._14_2_ = 0x206e;
          local_148._0_8_ = 0xe;
          local_148[0x16] = '\0';
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_130._0_1_ = false;
          local_130._1_1_ = false;
          local_130._2_1_ = false;
          local_130._3_1_ = false;
          local_e8._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_e8._M_value + 0x10);
          if ((_Base_ptr)local_110._0_8_ == (_Base_ptr)(local_110 + 0x10)) {
            local_e8._24_8_ = local_110._24_8_;
          }
          else {
            local_e8._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_110._0_8_;
          }
          local_e8._16_8_ = local_110._16_8_;
          local_e8._M_value._M_string_length = local_110._8_8_;
          local_110._8_8_ = (_Elt_pointer)0x0;
          local_110._16_8_ = local_110._16_8_ & 0xffffffffffffff00;
          local_c8 = true;
          local_158._0_8_ = this;
          local_158._8_8_ = local_148 + 8;
          local_110._0_8_ = (_Base_ptr)(local_110 + 0x10);
          ExecuteCommand(this,(cmListFileFunction *)
                              ((long)&(pDVar9->FilePath)._M_dataplus._M_p + lVar8),
                         (cmExecutionStatus *)local_158,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_e8);
          if ((local_c8 == true) &&
             (local_c8 = false,
             local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10)))
          {
            operator_delete((void *)local_e8._M_value._M_dataplus._M_p,(ulong)(local_e8._16_8_ + 1))
            ;
          }
          bVar3 = true;
          if (cmSystemTools::s_FatalErrorOccurred == false) {
            bVar3 = cmSystemTools::GetInterruptFlag();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_128);
          if ((undefined1 *)local_158._8_8_ != local_148 + 8) {
            operator_delete((void *)local_158._8_8_,CONCAT26(local_148._14_2_,local_148._8_6_) + 1);
          }
          PopSnapshot(local_b8.Makefile,true);
          if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          cVar4 = bVar3 * '\x05';
        }
        if ((cVar4 != '\a') && (cVar4 != '\0')) break;
        uVar10 = uVar10 + 1;
        pDVar9 = (local_f0->Commands).
                 super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x50;
      } while (uVar10 < (ulong)(((long)(local_f0->Commands).
                                       super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar9 >>
                                4) * -0x3333333333333333));
    }
    DeferScope::~DeferScope(&local_b0);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_PARENT_LIST_FILE","");
  value_01._M_str = (char *)local_88;
  value_01._M_len = (size_t)local_80;
  AddDefinition(this,(string *)local_158,value_01);
  pcVar1 = local_38;
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_FILE","");
  value_02._M_str = local_a8._M_dataplus._M_p;
  value_02._M_len = local_a8._M_string_length;
  AddDefinition(this,(string *)local_158,value_02);
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_110,&local_a8);
  value_03._M_str = (char *)local_110._0_8_;
  value_03._M_len = local_110._8_8_;
  AddDefinition(this,(string *)local_158,value_03);
  if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_PARENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if (local_88 != local_78) {
    operator_delete(local_88,(ulong)((long)&local_78[0]->_M_color + 1));
  }
  return;
}

Assistant:

void cmMakefile::RunListFile(cmListFile const& listFile,
                             std::string const& filenametoread,
                             DeferCommands* defer)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread));

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status(*this);
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccurred()) {
      break;
    }
    if (status.GetReturnInvoked()) {
      this->RaiseScope(status.GetReturnVariables());
      // Exit early due to return command.
      break;
    }
  }

  // Run any deferred commands.
  if (defer) {
    // Add a backtrace level indicating calls are deferred.
    DeferScope scope(this, filenametoread);

    // Iterate by index in case one deferred call schedules another.
    // NOLINTNEXTLINE(modernize-loop-convert)
    for (size_t i = 0; i < defer->Commands.size(); ++i) {
      DeferCommand& d = defer->Commands[i];
      if (d.Id.empty()) {
        // Canceled.
        continue;
      }
      // Mark as executed.
      std::string id = std::move(d.Id);

      // The deferred call may have come from another file.
      DeferCallScope callScope(this, d.FilePath);

      cmExecutionStatus status(*this);
      this->ExecuteCommand(d.Command, status, std::move(id));
      if (cmSystemTools::GetFatalErrorOccurred()) {
        break;
      }
    }
  }

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile));
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}